

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPClient.cpp
# Opt level: O3

string * __thiscall
TCPClient::Sendnix(string *__return_storage_ptr__,TCPClient *this,string *hostname,
                  string *portNumber,string *message)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  char *pcVar7;
  addrinfo *host_info_list;
  string msg;
  char incomming_data_buffer [1000];
  addrinfo *local_460;
  char *local_458 [2];
  char local_448 [16];
  addrinfo local_438;
  char local_408 [1000];
  
  local_438.ai_flags = 0;
  local_438.ai_family = 0;
  local_438.ai_addrlen = 0;
  local_438._20_4_ = 0;
  local_438.ai_addr = (sockaddr *)0x0;
  local_438.ai_canonname = (char *)0x0;
  local_438.ai_next = (addrinfo *)0x0;
  local_438.ai_socktype = 1;
  local_438.ai_protocol = 0;
  iVar2 = getaddrinfo((hostname->_M_dataplus)._M_p,(portNumber->_M_dataplus)._M_p,&local_438,
                      &local_460);
  if (iVar2 == 0) {
    iVar2 = socket(local_460->ai_family,local_460->ai_socktype,local_460->ai_protocol);
    if (iVar2 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "ERROR: Could not open socket";
      pcVar6 = "";
    }
    else {
      iVar3 = connect(iVar2,local_460->ai_addr,local_460->ai_addrlen);
      if (iVar3 != -1) {
        pcVar1 = (message->_M_dataplus)._M_p;
        local_458[0] = local_448;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_458,pcVar1,pcVar1 + message->_M_string_length);
        pcVar6 = local_458[0];
        sVar4 = strlen(local_458[0]);
        send(iVar2,pcVar6,(long)(int)sVar4,0);
        sVar5 = recv(iVar2,local_408,1000,0);
        if (sVar5 == -1) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"ERROR: Error when recieving","");
        }
        else if (sVar5 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"ERROR: Host shut down","");
        }
        else {
          local_408[sVar5] = '\0';
          freeaddrinfo(local_460);
          close(iVar2);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar4 = strlen(local_408);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,local_408,local_408 + sVar4);
        }
        if (local_458[0] == local_448) {
          return __return_storage_ptr__;
        }
        operator_delete(local_458[0]);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar7 = "ERROR: Could not connect";
      pcVar6 = "";
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "ERROR: Hostname could not be resolved";
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

string TCPClient::Sendnix(string hostname, string portNumber, string message) {
  // TCP client
  int status;
  // The struct that getaddrinfo() fills up with data.
  struct addrinfo host_info;
  // Pointer to the to the linked list of host_info's.
  struct addrinfo *host_info_list;

  /* The MAN page of getaddrinfo() states "All  the other fields in the structure pointed
  to by hints must contain either 0 or a null pointer, as appropriate." When a struct
  is created in c++, it will be given a block of memory. This memory is not nessesary
  empty. Therefor we use the memset function to make sure all fields are NULL.
  */
  memset(&host_info, 0, sizeof host_info);

  host_info.ai_family = AF_UNSPEC;     // IP version not specified. Can be both.
  // Use SOCK_STREAM for TCP or SOCK_DGRAM for UDP.
  host_info.ai_socktype = SOCK_STREAM;

  /* Now fill up the linked list of host_info structs with google's address information.
  status = getaddrinfo("www.google.com", "80", &host_info, &host_info_list);*/
  status = getaddrinfo(hostname.c_str(), portNumber.c_str(), &host_info,
                        &host_info_list);
  // getaddrinfo returns 0 on succes, or some other value when an error occured.
  // (translated into human readable text by the gai_gai_strerror function).
  if (status != 0) {
    return std::string("ERROR: Hostname could not be resolved");
  }

  int socketfd;  // The socket descripter
  socketfd = socket(host_info_list->ai_family, host_info_list->ai_socktype,
                    host_info_list->ai_protocol);
  if (socketfd == -1) {
    return std::string("ERROR: Could not open socket");
  }

  status = connect(socketfd, host_info_list->ai_addr,
                    host_info_list->ai_addrlen);
  if (status == -1) {
    return std::string("ERROR: Could not connect");
  }

  std::string msg = message;
  int len;
  ssize_t bytes_sent;
  len = strlen(msg.c_str());
  bytes_sent = send(socketfd, msg.c_str(), len, 0);

  ssize_t bytes_recieved;
  char incomming_data_buffer[1000];
  bytes_recieved = recv(socketfd, incomming_data_buffer, 1000, 0);
  /*If no data arrives, the program will just wait here until
  some data arrives.*/
  if (bytes_recieved == 0) {
    return std::string("ERROR: Host shut down");
  }
  if (bytes_recieved == -1) {
    return std::string("ERROR: Error when recieving");
  }
  incomming_data_buffer[bytes_recieved] = '\0';

  freeaddrinfo(host_info_list);

  close(socketfd);

  return std::string(incomming_data_buffer);
}